

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDefaultVertexAttributeTests.cpp
# Opt level: O0

Vector<float,_2> __thiscall
deqp::gles2::Functional::(anonymous_namespace)::convertToTypeVec<float,2,float,4>
          (_anonymous_namespace_ *this,Vector<float,_4> *v)

{
  float fVar1;
  Vector<float,_2> VVar2;
  int iVar3;
  float *pfVar4;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  undefined4 local_20;
  undefined4 local_1c;
  int ndx_1;
  int ndx;
  Vector<float,_4> *v_local;
  Vector<float,_2> *retVal;
  
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)this);
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    pfVar4 = tcu::Vector<float,_2>::operator[]((Vector<float,_2> *)this,local_1c);
    *pfVar4 = 0.0;
  }
  local_20 = 0;
  while( true ) {
    iVar3 = de::min<int>(2,4);
    if (iVar3 <= local_20) break;
    pfVar4 = tcu::Vector<float,_4>::operator[](v,local_20);
    fVar1 = *pfVar4;
    pfVar4 = tcu::Vector<float,_2>::operator[]((Vector<float,_2> *)this,local_20);
    *pfVar4 = fVar1;
    local_20 = local_20 + 1;
  }
  VVar2.m_data[1] = extraout_XMM0_Db;
  VVar2.m_data[0] = extraout_XMM0_Da;
  return (Vector<float,_2>)VVar2.m_data;
}

Assistant:

tcu::Vector<T1, S1> convertToTypeVec (const tcu::Vector<T2, S2>& v)
{
	tcu::Vector<T1, S1> retVal;

	for (int ndx = 0; ndx < S1; ++ndx)
		retVal[ndx] = T1(0);

	if (S1 == 4)
		retVal[3] = T1(1);

	for (int ndx = 0; ndx < de::min(S1, S2); ++ndx)
		retVal[ndx] = T1(v[ndx]);

	return retVal;
}